

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,string_view generator)

{
  iterator iVar1;
  iterator iVar2;
  HelicsException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  _Elt_pointer pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  string_view message;
  key_type local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  key_type local_30;
  
  local_80._M_str = generator._M_str;
  local_80._M_len = generator._M_len;
  local_30._M_str = key._M_str;
  local_30._M_len = key._M_len;
  iVar1 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_30);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,local_30._M_str,local_30._M_str + local_30._M_len);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70," was not recognized as a valid publication");
    local_50 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar6 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar6) {
      local_40 = paVar6->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar6->_M_allocated_capacity;
    }
    local_48 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    message._M_str = (char *)local_50;
    message._M_len = local_48;
    HelicsException::HelicsException(this_00,message);
    *(undefined ***)this_00 = &PTR__HelicsException_0053eaf0;
    __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  iVar2 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->generatorLookup)._M_t,&local_80);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header) {
    pSVar5 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar4 = ((long)pSVar5 -
             (long)(this->sources).
                   super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 8) +
            (long)*(int *)&iVar1._M_node[1]._M_left;
    if ((long)uVar4 < 0) {
      uVar7 = (long)uVar4 >> 1;
    }
    else {
      if (uVar4 < 2) {
        pSVar5 = pSVar5 + *(int *)&iVar1._M_node[1]._M_left;
        goto LAB_00287b80;
      }
      uVar7 = uVar4 >> 1;
    }
    pSVar5 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar7] + uVar4 + uVar7 * -2;
LAB_00287b80:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pSVar5->generatorName,0,(pSVar5->generatorName)._M_string_length,local_80._M_str,
               local_80._M_len);
    return;
  }
  pSVar5 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar4 = ((long)pSVar5 -
           (long)(this->sources).
                 super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 8) +
          (long)*(int *)&iVar1._M_node[1]._M_left;
  if ((long)uVar4 < 0) {
    uVar7 = (long)uVar4 >> 1;
  }
  else {
    if (uVar4 < 2) {
      pSVar5 = pSVar5 + *(int *)&iVar1._M_node[1]._M_left;
      goto LAB_00287b5c;
    }
    uVar7 = uVar4 >> 1;
  }
  pSVar5 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar7] + uVar4 + uVar7 * -2;
LAB_00287b5c:
  pSVar5->generatorIndex = *(int *)&iVar2._M_node[1]._M_left;
  return;
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, std::string_view generator)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        auto findGen = generatorLookup.find(generator);
        if (findGen != generatorLookup.end()) {
            sources[fnd->second].generatorIndex = findGen->second;
            return;
        }
        sources[fnd->second].generatorName = generator;
    }